

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadAnimationTracks(OgreXmlSerializer *this,Animation *dest)

{
  int iVar1;
  string *psVar2;
  runtime_error *this_00;
  VertexAnimationTrack track;
  string asStack_238 [32];
  undefined1 local_218 [8];
  _Alloc_hider local_210;
  char local_200 [16];
  vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_> local_1f0;
  vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_> local_1d8;
  pointer local_1c0;
  string local_1a8 [11];
  
  NextNode_abi_cxx11_(this);
  iVar1 = std::__cxx11::string::compare((char *)&this->m_currentNodeName);
  if (iVar1 == 0) {
    do {
      VertexAnimationTrack::VertexAnimationTrack((VertexAnimationTrack *)local_218);
      local_218._0_4_ = VAT_TRANSFORM;
      ReadAttribute<std::__cxx11::string>(local_1a8,this,"bone");
      std::__cxx11::string::operator=((string *)&local_210,(string *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      psVar2 = NextNode_abi_cxx11_(this);
      iVar1 = std::__cxx11::string::compare((char *)psVar2);
      if (iVar1 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"No <keyframes> found in <track> ",0x20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(dest->name)._M_dataplus._M_p,(dest->name)._M_string_length)
        ;
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,asStack_238);
        *(undefined ***)this_00 = &PTR__runtime_error_00900168;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      ReadAnimationKeyFrames(this,dest,(VertexAnimationTrack *)local_218);
      std::
      vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
      ::push_back(&dest->tracks,(VertexAnimationTrack *)local_218);
      if (local_1c0 != (pointer)0x0) {
        operator_delete(local_1c0);
      }
      std::vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_>::
      ~vector(&local_1d8);
      std::vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_>::~vector
                (&local_1f0);
      if (local_210._M_p != local_200) {
        operator_delete(local_210._M_p);
      }
      iVar1 = std::__cxx11::string::compare((char *)&this->m_currentNodeName);
    } while (iVar1 == 0);
  }
  return;
}

Assistant:

void OgreXmlSerializer::ReadAnimationTracks(Animation *dest)
{
    NextNode();
    while(m_currentNodeName == nnTrack)
    {
        VertexAnimationTrack track;
        track.type = VertexAnimationTrack::VAT_TRANSFORM;
        track.boneName = ReadAttribute<std::string>("bone");

        if (NextNode() != nnKeyFrames) {
            throw DeadlyImportError(Formatter::format() << "No <keyframes> found in <track> " << dest->name);
        }

        ReadAnimationKeyFrames(dest, &track);

        dest->tracks.push_back(track);
    }
}